

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O2

void anon_unknown.dwarf_5a11f::dump_source_class(MetaClass *top,ofstream *file)

{
  string *psVar1;
  pointer psVar2;
  pointer psVar3;
  element_type *peVar4;
  MetaClass *pMVar5;
  string *psVar6;
  bool bVar7;
  ostream *poVar8;
  shared_ptr<MetaClass> *c_1;
  pointer psVar9;
  pointer psVar10;
  shared_ptr<MetaProperty> *p;
  shared_ptr<MetaClass> *child;
  shared_ptr<MetaProperty> *p_1;
  allocator<char> local_61;
  MetaClass *local_60;
  string *local_58;
  string local_50;
  
  psVar2 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (top->subclasses).
                 super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar2; psVar10 = psVar10 + 1
      ) {
    dump_source_class((psVar10->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      file);
  }
  psVar1 = &top->name;
  poVar8 = std::operator<<((ostream *)file,(string *)psVar1);
  poVar8 = std::operator<<(poVar8,"::");
  local_58 = (string *)psVar1;
  poVar8 = std::operator<<(poVar8,(string *)psVar1);
  std::operator<<(poVar8,"(QObject *parent) : QObject(parent)");
  psVar2 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = top;
  for (psVar10 = (top->subclasses).
                 super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar2; psVar10 = psVar10 + 1
      ) {
    poVar8 = std::operator<<((ostream *)file,',');
    poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<(poVar8,"\t_");
    decapitalize(&local_50,
                 &((psVar10->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  name,0);
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,"(new ");
    poVar8 = std::operator<<(poVar8,(string *)
                                    &((psVar10->
                                      super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->name);
    std::operator<<(poVar8,"(this))");
    std::__cxx11::string::~string((string *)&local_50);
  }
  psVar3 = (local_60->properties).
           super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (local_60->properties).
                super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar3; psVar9 = psVar9 + 1) {
    if ((((psVar9->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        default_value)._M_string_length != 0) {
      poVar8 = std::operator<<((ostream *)file,',');
      poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<(poVar8,"\t_");
      poVar8 = std::operator<<(poVar8,(string *)
                                      &((psVar9->
                                        super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->name);
      poVar8 = std::operator<<(poVar8,'(');
      poVar8 = std::operator<<(poVar8,(string *)
                                      &((psVar9->
                                        super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->default_value);
      std::operator<<(poVar8,')');
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)file);
  poVar8 = std::operator<<((ostream *)file,'{');
  std::endl<char,std::char_traits<char>>(poVar8);
  pMVar5 = local_60;
  if ((local_60->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::operator<<((ostream *)file,"\tload();\n");
  }
  poVar8 = std::operator<<((ostream *)file,'}');
  std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>((ostream *)file);
  dump_source_get_methods(file,pMVar5);
  psVar2 = (pMVar5->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (pMVar5->subclasses).
                 super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pMVar5 = local_60, psVar10 != psVar2;
      psVar10 = psVar10 + 1) {
    poVar8 = std::operator<<((ostream *)file,
                             (string *)
                             &((psVar10->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->name);
    poVar8 = std::operator<<(poVar8,"* ");
    poVar8 = std::operator<<(poVar8,local_58);
    poVar8 = std::operator<<(poVar8,"::");
    decapitalize(&local_50,
                 &((psVar10->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  name,0);
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,"() const");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_50);
    poVar8 = std::operator<<((ostream *)file,'{');
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,"\treturn _");
    decapitalize(&local_50,
                 &((psVar10->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  name,0);
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,';');
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_50);
    poVar8 = std::operator<<((ostream *)file,'}');
    std::endl<char,std::char_traits<char>>(poVar8);
    std::endl<char,std::char_traits<char>>((ostream *)file);
  }
  dump_source_set_methods(file,local_60,true);
  psVar3 = (pMVar5->properties).
           super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (pMVar5->properties).
                super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar3; psVar9 = psVar9 + 1) {
    poVar8 = std::operator<<((ostream *)file,"void ");
    poVar8 = std::operator<<(poVar8,local_58);
    poVar8 = std::operator<<(poVar8,"::set");
    capitalize(&local_50,
               &((psVar9->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                name,0);
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,"Rule(std::function<bool(");
    poVar8 = std::operator<<(poVar8,(string *)
                                    &((psVar9->
                                      super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->type);
    poVar8 = std::operator<<(poVar8,")> rule)");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_50);
    poVar8 = std::operator<<((ostream *)file,'{');
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,'\t');
    poVar8 = std::operator<<(poVar8,(string *)
                                    &((psVar9->
                                      super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->name);
    poVar8 = std::operator<<(poVar8,"Rule = rule;");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,'}');
    std::endl<char,std::char_traits<char>>(poVar8);
    std::endl<char,std::char_traits<char>>((ostream *)file);
  }
  psVar3 = (local_60->properties).
           super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (local_60->properties).
                super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar3; psVar9 = psVar9 + 1) {
    peVar4 = (psVar9->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar4->default_value)._M_string_length != 0) {
      poVar8 = std::operator<<((ostream *)file,(string *)&peVar4->type);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,local_58);
      poVar8 = std::operator<<(poVar8,"::");
      poVar8 = std::operator<<(poVar8,(string *)
                                      &((psVar9->
                                        super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->name);
      poVar8 = std::operator<<(poVar8,"Default() const");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)file,'{');
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)file,'\t');
      poVar8 = std::operator<<(poVar8,"return ");
      poVar8 = std::operator<<(poVar8,(string *)
                                      &((psVar9->
                                        super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->default_value);
      poVar8 = std::operator<<(poVar8,';');
      std::endl<char,std::char_traits<char>>(poVar8);
      std::operator<<((ostream *)file,'}');
      std::endl<char,std::char_traits<char>>((ostream *)file);
    }
  }
  poVar8 = std::operator<<((ostream *)file,"void ");
  poVar8 = std::operator<<(poVar8,local_58);
  poVar8 = std::operator<<(poVar8,"::loadDefaults()");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)file,"{");
  std::endl<char,std::char_traits<char>>(poVar8);
  psVar2 = (local_60->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (local_60->subclasses).
                 super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar2; psVar10 = psVar10 + 1
      ) {
    poVar8 = std::operator<<((ostream *)file,"\t_");
    decapitalize(&local_50,
                 &((psVar10->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  name,0);
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,"->loadDefaults();");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  psVar3 = (local_60->properties).
           super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (local_60->properties).
                super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar3; psVar9 = psVar9 + 1) {
    if ((((psVar9->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        default_value)._M_string_length != 0) {
      poVar8 = std::operator<<((ostream *)file,"\tset");
      capitalize(&local_50,
                 &((psVar9->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  name,0);
      poVar8 = std::operator<<(poVar8,(string *)&local_50);
      poVar8 = std::operator<<(poVar8,'(');
      poVar8 = std::operator<<(poVar8,(string *)
                                      &((psVar9->
                                        super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->default_value);
      poVar8 = std::operator<<(poVar8,");");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  poVar8 = std::operator<<((ostream *)file,"}");
  std::endl<char,std::char_traits<char>>(poVar8);
  pMVar5 = local_60;
  if ((local_60->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    poVar8 = std::operator<<((ostream *)file,"void ");
    poVar8 = std::operator<<(poVar8,local_58);
    poVar8 = std::operator<<(poVar8,"::sync()");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,'{');
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar7 = class_or_subclass_have_properties(pMVar5);
    if (bVar7) {
      poVar8 = std::operator<<((ostream *)file,
                               "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"internal_config",&local_61);
      dump_source_class_settings_set_values(pMVar5,file,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    poVar8 = std::operator<<((ostream *)file,'}');
    std::endl<char,std::char_traits<char>>(poVar8);
    std::endl<char,std::char_traits<char>>((ostream *)file);
    poVar8 = std::operator<<((ostream *)file,"void ");
    poVar8 = std::operator<<(poVar8,local_58);
    poVar8 = std::operator<<(poVar8,"::load()");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,'{');
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar7 = class_or_subclass_have_properties(pMVar5);
    if (bVar7) {
      poVar8 = std::operator<<((ostream *)file,
                               "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"internal_config",&local_61);
      dump_source_class_settings_get_values(pMVar5,file,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    poVar8 = std::operator<<((ostream *)file,'}');
    std::endl<char,std::char_traits<char>>(poVar8);
    std::endl<char,std::char_traits<char>>((ostream *)file);
    psVar6 = local_58;
    poVar8 = std::operator<<((ostream *)file,local_58);
    poVar8 = std::operator<<(poVar8,"* ");
    poVar8 = std::operator<<(poVar8,psVar6);
    poVar8 = std::operator<<(poVar8,"::self()");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,"{");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,"\tstatic ");
    poVar8 = std::operator<<(poVar8,psVar6);
    poVar8 = std::operator<<(poVar8," s;");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,"\treturn &s;");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)file,"}");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  return;
}

Assistant:

void dump_source_class(MetaClass *top, std::ofstream &file) {
  for (auto &&child : top->subclasses) {
    dump_source_class(child.get(), file);
  }

  // Constructors.
  file << top->name << "::" << top->name
       << "(QObject *parent) : QObject(parent)";
  for (auto &&c : top->subclasses) {
    file << ',' << std::endl
         << "\t_" << decapitalize(c->name, 0) << "(new " << c->name
         << "(this))";
  }
  for (auto &&p : top->properties) {
    if (p->default_value.size()) {
      file << ',' << std::endl
           << "\t_" << p->name << '(' << p->default_value << ')';
    }
  }
  file << std::endl;
  file << '{' << std::endl;
  if (!top->parent) {
    file << "\tload();\n";
  }
  file << '}' << std::endl;
  file << std::endl;

  // get - methods.
  dump_source_get_methods(file, top);
  for (auto &&c : top->subclasses) {
    file << c->name << "* " << top->name << "::" << decapitalize(c->name)
         << "() const" << std::endl;
    file << '{' << std::endl;
    file << "\treturn _" << decapitalize(c->name) << ';' << std::endl;
    file << '}' << std::endl;
    file << std::endl;
  }

  // set-methods
  dump_source_set_methods(file, top);

  // rule-methods {
  for (auto &&p : top->properties) {
    file << "void " << top->name << "::set" << capitalize(p->name, 0)
         << "Rule(std::function<bool(" << p->type << ")> rule)" << std::endl;
    file << '{' << std::endl;
    file << '\t' << p->name << "Rule = rule;" << std::endl;
    file << '}' << std::endl;
    file << std::endl;
  }

  // default values
  for (auto &&p : top->properties) {
      if (p->default_value.size()) {
          file << p->type << " " << top->name << "::" << p->name << "Default() const" << std::endl;
          file << '{' << std::endl;
          file << '\t' << "return " << p->default_value << ';' << std::endl;
          file << '}';
          file << std::endl;
    }
  }

  // load defaults
  file << "void " << top->name << "::loadDefaults()" << std::endl;
  file << "{" << std::endl;
  for (auto &&c : top->subclasses) {
    file << "\t_" << decapitalize(c->name, 0) << "->loadDefaults();" << std::endl;
  }

  for (auto &&p : top->properties) {
    if (p->default_value.size()) {
        file << "\tset" << capitalize(p->name, 0) << '(' << p->default_value << ");" << std::endl;
    }
  }
  file << "}" << std::endl;

  // main preferences class
  if (!top->parent) {
      // The Sync method.
    file << "void " << top->name << "::sync()" << std::endl;
    file << '{' << std::endl;
    if (class_or_subclass_have_properties(top)) {
      file << "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();" << std::endl;
      dump_source_class_settings_set_values(top, file, "internal_config");
    }
    file << '}' << std::endl;
    file << std::endl;

    // The "load" method.
    file << "void " << top->name << "::load()" << std::endl;
    file << '{' << std::endl;
    if (class_or_subclass_have_properties(top)) {
      file << "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();" << std::endl;
      dump_source_class_settings_get_values(top, file, "internal_config");
    }
    file << '}' << std::endl;
    file << std::endl;
    file << top->name << "* " << top->name << "::self()" << std::endl;
    file << "{" << std::endl;
    file << "\tstatic " << top->name << " s;" << std::endl;
    file << "\treturn &s;" << std::endl;
    file << "}" << std::endl;
  }
}